

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

string * replaceHtmlSymbols(string *__return_storage_ptr__,string *str)

{
  string_view replacement;
  string_view replacement_00;
  string_view replacement_01;
  string_view replacement_02;
  string_view replacement_03;
  string_view replacement_04;
  string_view find;
  string_view find_00;
  string_view find_01;
  string_view find_02;
  string_view find_03;
  string_view find_04;
  
  replacement._M_str = "&";
  replacement._M_len = 1;
  find._M_str = "&amp;";
  find._M_len = 5;
  ::str::replace_all(str,find,replacement);
  replacement_00._M_str = "\"";
  replacement_00._M_len = 1;
  find_00._M_str = "&quot;";
  find_00._M_len = 6;
  ::str::replace_all(str,find_00,replacement_00);
  replacement_01._M_str = "\'";
  replacement_01._M_len = 1;
  find_01._M_str = "&apos;";
  find_01._M_len = 6;
  ::str::replace_all(str,find_01,replacement_01);
  replacement_02._M_str = ">";
  replacement_02._M_len = 1;
  find_02._M_str = "&gt;";
  find_02._M_len = 4;
  ::str::replace_all(str,find_02,replacement_02);
  replacement_03._M_str = "<";
  replacement_03._M_len = 1;
  find_03._M_str = "&lt;";
  find_03._M_len = 4;
  ::str::replace_all(str,find_03,replacement_03);
  replacement_04._M_str = "\"";
  replacement_04._M_len = 1;
  find_04._M_str = "&#x200B;";
  find_04._M_len = 8;
  ::str::replace_all(str,find_04,replacement_04);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string replaceHtmlSymbols(std::string str) {
    str::replace_all(str, "&amp;", "&");
    str::replace_all(str, "&quot;", "\"");
    str::replace_all(str, "&apos;", "'");
    str::replace_all(str, "&gt;", ">");
    str::replace_all(str, "&lt;", "<");
    str::replace_all(str, "&#x200B;", "\"");
    return str;
}